

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall
HighsPrimalHeuristics::HighsPrimalHeuristics(HighsPrimalHeuristics *this,HighsMipSolver *mipsolver)

{
  this->mipsolver = mipsolver;
  this->total_repair_lp = 0;
  this->total_repair_lp_feasible = 0;
  this->total_repair_lp_iterations = 0;
  this->lp_iterations = 0;
  HighsRandom::initialise
            (&this->randgen,(mipsolver->options_mip_->super_HighsOptionsStruct).random_seed);
  (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->successObservations = 0.0;
  this->numSuccessObservations = 0;
  this->infeasObservations = 0.0;
  this->numInfeasObservations = 0;
  return;
}

Assistant:

HighsPrimalHeuristics::HighsPrimalHeuristics(HighsMipSolver& mipsolver)
    : mipsolver(mipsolver),
      total_repair_lp(0),
      total_repair_lp_feasible(0),
      total_repair_lp_iterations(0),
      lp_iterations(0),
      randgen(mipsolver.options_mip_->random_seed) {
  successObservations = 0;
  numSuccessObservations = 0;
  infeasObservations = 0;
  numInfeasObservations = 0;
}